

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::SerializeGroupTo<google::protobuf::internal::ArrayOutput>
               (MessageLite *msg,void *table_ptr,ArrayOutput *output)

{
  uint8_t *puVar1;
  
  if (table_ptr != (void *)0x0) {
    puVar1 = SerializeInternalToArray
                       ((uint8_t *)msg,(FieldMetadata *)(*(long *)((long)table_ptr + 8) + 0x18),
                        *table_ptr + -1,output->is_deterministic,output->ptr);
    output->ptr = puVar1;
    return;
  }
  SerializeMessageNoTable(msg,output);
  return;
}

Assistant:

void SerializeGroupTo(const MessageLite* msg, const void* table_ptr,
                      O* output) {
  const SerializationTable* table =
      static_cast<const SerializationTable*>(table_ptr);
  if (!table) {
    // Proto1
    SerializeMessageNoTable(msg, output);
    return;
  }
  const FieldMetadata* field_table = table->field_table;
  const uint8_t* base = reinterpret_cast<const uint8_t*>(msg);
  int cached_size =
      *reinterpret_cast<const int32_t*>(base + field_table->offset);
  int num_fields = table->num_fields - 1;
  SerializeMessageDispatch(*msg, field_table + 1, num_fields, cached_size,
                           output);
}